

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi-timeout.c
# Opt level: O0

int lws_timed_callback_vh_protocol_us(lws_vhost *vh,lws_protocols *prot,int reason,lws_usec_t us)

{
  int iVar1;
  lws_timed_vh_protocol *__s;
  lws_timed_vh_protocol *p;
  lws_usec_t us_local;
  int reason_local;
  lws_protocols *prot_local;
  lws_vhost *vh_local;
  
  __s = (lws_timed_vh_protocol *)lws_realloc((void *)0x0,0x48,"timed_vh");
  if (__s == (lws_timed_vh_protocol *)0x0) {
    vh_local._4_4_ = 1;
  }
  else {
    memset(__s,0,0x48);
    iVar1 = lws_pthread_self_to_tsi(vh->context);
    __s->tsi_req = iVar1;
    if (__s->tsi_req < 0) {
      __s->tsi_req = 0;
    }
    __s->protocol = prot;
    __s->reason = reason;
    __s->vhost = vh;
    (__s->sul).cb = lws_sul_timed_callback_vh_protocol_cb;
    __lws_sul_insert(&vh->context->pt[__s->tsi_req].pt_sul_owner,&__s->sul,us);
    __s->next = vh->timed_vh_protocol_list;
    vh->timed_vh_protocol_list = __s;
    vh_local._4_4_ = 0;
  }
  return vh_local._4_4_;
}

Assistant:

int
lws_timed_callback_vh_protocol_us(struct lws_vhost *vh,
				  const struct lws_protocols *prot, int reason,
				  lws_usec_t us)
{
	struct lws_timed_vh_protocol *p = (struct lws_timed_vh_protocol *)
			lws_malloc(sizeof(*p), "timed_vh");

	if (!p)
		return 1;

	memset(p, 0, sizeof(*p));

	p->tsi_req = lws_pthread_self_to_tsi(vh->context);
	if (p->tsi_req < 0) /* not called from a service thread --> tsi 0 */
		p->tsi_req = 0;

	lws_context_lock(vh->context, __func__); /* context ----------------- */

	p->protocol = prot;
	p->reason = reason;
	p->vhost = vh;

	p->sul.cb = lws_sul_timed_callback_vh_protocol_cb;
	/* list is always at the very top of the sul */
	__lws_sul_insert(&vh->context->pt[p->tsi_req].pt_sul_owner,
			 (lws_sorted_usec_list_t *)&p->sul.list, us);

	// lwsl_notice("%s: %s.%s %d\n", __func__, vh->name, prot->name, secs);

	lws_vhost_lock(vh); /* vhost ---------------------------------------- */
	p->next = vh->timed_vh_protocol_list;
	vh->timed_vh_protocol_list = p;
	lws_vhost_unlock(vh); /* -------------------------------------- vhost */

	lws_context_unlock(vh->context); /* ------------------------- context */

	return 0;
}